

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

bool __thiscall
testing::internal::ElementsAreMatcherImpl<const_pstore::repo::container<unsigned_char>_&>::
MatchAndExplain(ElementsAreMatcherImpl<const_pstore::repo::container<unsigned_char>_&> *this,
               container<unsigned_char> *container,MatchResultListener *listener)

{
  ostream *poVar1;
  bool bVar2;
  int iVar3;
  MatchResultListener *pMVar4;
  pointer pMVar5;
  pointer pMVar6;
  uchar *puVar7;
  uchar *puVar8;
  long lVar9;
  uchar *puVar10;
  long lVar11;
  uchar *puVar12;
  pointer pbVar13;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  explanations;
  StringMatchResultListener s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_200;
  long *local_1e8 [2];
  long local_1d8 [2];
  undefined1 local_1c8 [32];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  poVar1 = listener->stream_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_200,
           ((long)(this->matchers_).
                  super__Vector_base<testing::Matcher<const_unsigned_char_&>,_std::allocator<testing::Matcher<const_unsigned_char_&>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->matchers_).
                  super__Vector_base<testing::Matcher<const_unsigned_char_&>,_std::allocator<testing::Matcher<const_unsigned_char_&>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
           (allocator_type *)local_1c8);
  puVar10 = container->begin_;
  if (puVar10 == container->end_) {
    pMVar5 = (this->matchers_).
             super__Vector_base<testing::Matcher<const_unsigned_char_&>,_std::allocator<testing::Matcher<const_unsigned_char_&>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pMVar6 = (this->matchers_).
             super__Vector_base<testing::Matcher<const_unsigned_char_&>,_std::allocator<testing::Matcher<const_unsigned_char_&>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pMVar6 == pMVar5) {
LAB_001181b2:
      bVar2 = true;
      if (pMVar6 != pMVar5 && poVar1 != (ostream *)0x0) {
        lVar11 = 8;
        bVar2 = false;
        lVar9 = 0;
        do {
          pbVar13 = local_200.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (*(long *)((long)&((local_200.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar11) != 0) {
            if (bVar2) {
              MatchResultListener::operator<<(listener,(char (*) [7])",\nand ");
            }
            pMVar4 = MatchResultListener::operator<<(listener,(char (*) [16])"whose element #");
            if (pMVar4->stream_ != (ostream *)0x0) {
              std::ostream::_M_insert<unsigned_long>((ulong)pMVar4->stream_);
            }
            pMVar4 = MatchResultListener::operator<<(pMVar4,(char (*) [11])" matches, ");
            bVar2 = true;
            if (pMVar4->stream_ != (ostream *)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        (pMVar4->stream_,*(char **)((long)pbVar13 + lVar11 + -8),
                         *(long *)((long)&(pbVar13->_M_dataplus)._M_p + lVar11));
            }
          }
          lVar9 = lVar9 + 1;
          lVar11 = lVar11 + 0x20;
        } while (lVar9 != ((long)(this->matchers_).
                                 super__Vector_base<testing::Matcher<const_unsigned_char_&>,_std::allocator<testing::Matcher<const_unsigned_char_&>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->matchers_).
                                 super__Vector_base<testing::Matcher<const_unsigned_char_&>,_std::allocator<testing::Matcher<const_unsigned_char_&>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          -0x5555555555555555);
        bVar2 = true;
      }
      goto LAB_0011827e;
    }
  }
  else {
    lVar9 = 0;
    lVar11 = 0;
    puVar12 = (uchar *)0x0;
    puVar7 = puVar10;
    do {
      puVar8 = puVar10 + (long)puVar12;
      pMVar5 = (this->matchers_).
               super__Vector_base<testing::Matcher<const_unsigned_char_&>,_std::allocator<testing::Matcher<const_unsigned_char_&>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (puVar12 ==
          (uchar *)(((long)(this->matchers_).
                           super__Vector_base<testing::Matcher<const_unsigned_char_&>,_std::allocator<testing::Matcher<const_unsigned_char_&>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar5 >> 3) *
                   -0x5555555555555555)) {
        bVar2 = false;
        goto LAB_00118073;
      }
      if (poVar1 == (ostream *)0x0) {
        local_1c8._8_8_ = (ostream *)0x0;
        local_1c8._0_8_ = &PTR__MatchResultListener_0019a9b0;
        bVar2 = MatcherBase<const_unsigned_char_&>::MatchAndExplain
                          ((MatcherBase<const_unsigned_char_&> *)
                           ((long)&(pMVar5->super_MatcherBase<const_unsigned_char_&>).
                                   super_MatcherDescriberInterface._vptr_MatcherDescriberInterface +
                           lVar11),puVar8,(MatchResultListener *)local_1c8);
      }
      else {
        local_1c8._8_8_ = local_1a8;
        local_1c8._0_8_ = &PTR__StringMatchResultListener_0019aab8;
        std::__cxx11::stringstream::stringstream((stringstream *)(local_1c8 + 0x10));
        bVar2 = MatcherBase<const_unsigned_char_&>::MatchAndExplain
                          ((MatcherBase<const_unsigned_char_&> *)
                           ((long)&(((this->matchers_).
                                     super__Vector_base<testing::Matcher<const_unsigned_char_&>,_std::allocator<testing::Matcher<const_unsigned_char_&>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super_MatcherBase<const_unsigned_char_&>).
                                   super_MatcherDescriberInterface._vptr_MatcherDescriberInterface +
                           lVar11),puVar8,(MatchResultListener *)local_1c8);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=
                  ((string *)
                   ((long)&((local_200.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar9),
                   (string *)local_1e8);
        if (local_1e8[0] != local_1d8) {
          operator_delete(local_1e8[0],local_1d8[0] + 1);
        }
        local_1c8._0_8_ = &PTR__StringMatchResultListener_0019aab8;
        std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c8 + 0x10));
        std::ios_base::~ios_base(local_138);
      }
      if (bVar2 == false) {
        bVar2 = true;
        puVar8 = puVar7;
        goto LAB_00118073;
      }
      puVar7 = puVar7 + 1;
      puVar8 = puVar12 + 1;
      puVar12 = puVar12 + 1;
      lVar11 = lVar11 + 0x18;
      lVar9 = lVar9 + 0x20;
    } while (puVar10 + (long)puVar8 != container->end_);
    bVar2 = false;
    puVar8 = puVar10 + (long)puVar12;
LAB_00118073:
    puVar10 = container->end_ + ((long)puVar12 - (long)puVar8);
    if (puVar8 == container->end_) {
      puVar10 = puVar12;
    }
    pMVar5 = (this->matchers_).
             super__Vector_base<testing::Matcher<const_unsigned_char_&>,_std::allocator<testing::Matcher<const_unsigned_char_&>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pMVar6 = (this->matchers_).
             super__Vector_base<testing::Matcher<const_unsigned_char_&>,_std::allocator<testing::Matcher<const_unsigned_char_&>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar10 == (uchar *)(((long)pMVar6 - (long)pMVar5 >> 3) * -0x5555555555555555)) {
      if (!bVar2) goto LAB_001181b2;
      if (poVar1 != (ostream *)0x0) {
        pMVar4 = MatchResultListener::operator<<(listener,(char (*) [16])"whose element #");
        if (pMVar4->stream_ != (ostream *)0x0) {
          std::ostream::_M_insert<unsigned_long>((ulong)pMVar4->stream_);
        }
        MatchResultListener::operator<<(pMVar4,(char (*) [15])" doesn\'t match");
        pbVar13 = local_200.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + (long)puVar12;
        poVar1 = listener->stream_;
        iVar3 = std::__cxx11::string::compare((char *)pbVar13);
        bVar2 = false;
        if ((poVar1 == (ostream *)0x0) || (bVar2 = false, iVar3 == 0)) goto LAB_0011827e;
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar1,(pbVar13->_M_dataplus)._M_p,pbVar13->_M_string_length);
      }
    }
    else {
      bVar2 = false;
      if ((poVar1 == (ostream *)0x0) || (puVar10 == (uchar *)0x0)) goto LAB_0011827e;
      pMVar4 = MatchResultListener::operator<<(listener,(char (*) [11])"which has ");
      Elements((ElementsAreMatcherImpl<const_pstore::repo::container<unsigned_char>_&> *)local_1c8,
               (size_t)puVar10);
      MatchResultListener::operator<<(pMVar4,(Message *)local_1c8);
      if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
           )local_1c8._0_8_ !=
          (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        (**(code **)(*(_func_int **)local_1c8._0_8_ + 8))();
      }
    }
  }
  bVar2 = false;
LAB_0011827e:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_200);
  return bVar2;
}

Assistant:

bool MatchAndExplain(Container container,
                       MatchResultListener* listener) const override {
    // To work with stream-like "containers", we must only walk
    // through the elements in one pass.

    const bool listener_interested = listener->IsInterested();

    // explanations[i] is the explanation of the element at index i.
    ::std::vector<std::string> explanations(count());
    StlContainerReference stl_container = View::ConstReference(container);
    typename StlContainer::const_iterator it = stl_container.begin();
    size_t exam_pos = 0;
    bool mismatch_found = false;  // Have we found a mismatched element yet?

    // Go through the elements and matchers in pairs, until we reach
    // the end of either the elements or the matchers, or until we find a
    // mismatch.
    for (; it != stl_container.end() && exam_pos != count(); ++it, ++exam_pos) {
      bool match;  // Does the current element match the current matcher?
      if (listener_interested) {
        StringMatchResultListener s;
        match = matchers_[exam_pos].MatchAndExplain(*it, &s);
        explanations[exam_pos] = s.str();
      } else {
        match = matchers_[exam_pos].Matches(*it);
      }

      if (!match) {
        mismatch_found = true;
        break;
      }
    }
    // If mismatch_found is true, 'exam_pos' is the index of the mismatch.

    // Find how many elements the actual container has.  We avoid
    // calling size() s.t. this code works for stream-like "containers"
    // that don't define size().
    size_t actual_count = exam_pos;
    for (; it != stl_container.end(); ++it) {
      ++actual_count;
    }

    if (actual_count != count()) {
      // The element count doesn't match.  If the container is empty,
      // there's no need to explain anything as Google Mock already
      // prints the empty container.  Otherwise we just need to show
      // how many elements there actually are.
      if (listener_interested && (actual_count != 0)) {
        *listener << "which has " << Elements(actual_count);
      }
      return false;
    }

    if (mismatch_found) {
      // The element count matches, but the exam_pos-th element doesn't match.
      if (listener_interested) {
        *listener << "whose element #" << exam_pos << " doesn't match";
        PrintIfNotEmpty(explanations[exam_pos], listener->stream());
      }
      return false;
    }

    // Every element matches its expectation.  We need to explain why
    // (the obvious ones can be skipped).
    if (listener_interested) {
      bool reason_printed = false;
      for (size_t i = 0; i != count(); ++i) {
        const std::string& s = explanations[i];
        if (!s.empty()) {
          if (reason_printed) {
            *listener << ",\nand ";
          }
          *listener << "whose element #" << i << " matches, " << s;
          reason_printed = true;
        }
      }
    }
    return true;
  }